

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

void helicsTranslatorSetString(HelicsTranslator trans,char *prop,char *val,HelicsError *err)

{
  Translator *pTVar1;
  HelicsError *in_RCX;
  long in_RSI;
  Translator *translator;
  HelicsError *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  pTVar1 = getTranslator(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (pTVar1 != (Translator *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RCX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      (*(pTVar1->super_Interface)._vptr_Interface[6])(pTVar1,local_38,local_30,local_48,local_40);
    }
  }
  return;
}

Assistant:

void helicsTranslatorSetString(HelicsTranslator trans, const char* prop, const char* val, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        translator->setString(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}